

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Array<unsigned_char> * __thiscall
kj::anon_unknown_8::DiskHandle::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,DiskHandle *this,uint64_t offset,
          uint64_t size)

{
  void *pvVar1;
  MmapRange MVar2;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  MVar2 = getMmapRange(offset,size);
  pvVar1 = ::mmap((void *)0x0,MVar2.size,3,2,(this->fd).fd,MVar2.offset);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    __return_storage_ptr__->ptr = (uchar *)((long)pvVar1 + (offset - MVar2.offset));
    __return_storage_ptr__->size_ = size;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer;
    return __return_storage_ptr__;
  }
  __errno_location();
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  _::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  _::Debug::Fault::fatal(&local_40);
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const {
    auto range = getMmapRange(offset, size);
    void* mapping = ::mmap(NULL, range.size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<byte>(reinterpret_cast<byte*>(mapping) + (offset - range.offset),
                       size, mmapDisposer);
  }